

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_dist_wtd_convolve_y_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  CONV_BUF_TYPE *pCVar4;
  int16_t *piVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  byte *pbVar12;
  int iVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong uVar16;
  byte *local_78;
  ulong local_70;
  
  cVar6 = (char)conv_params->round_0;
  cVar9 = (char)conv_params->round_1 + cVar6;
  if (0 < h) {
    pCVar4 = conv_params->dst;
    uVar2 = filter_params_y->taps;
    iVar13 = (1 << (0x16U - cVar9 & 0x1f)) + (1 << (0x15U - cVar9 & 0x1f));
    piVar5 = filter_params_y->filter_ptr;
    iVar3 = conv_params->dst_stride;
    lVar11 = (long)src_stride;
    local_78 = src + (1 - (ulong)(uVar2 >> 1)) * lVar11;
    local_70 = 0;
    do {
      if (0 < w) {
        lVar8 = local_70 * (long)iVar3;
        uVar16 = 0;
        pbVar15 = local_78;
        do {
          if ((ulong)filter_params_y->taps == 0) {
            iVar10 = 0;
          }
          else {
            uVar14 = 0;
            iVar10 = 0;
            pbVar12 = pbVar15;
            do {
              iVar10 = iVar10 + (uint)*pbVar12 *
                                (int)*(short *)((long)piVar5 +
                                               uVar14 * 2 +
                                               (ulong)((subpel_y_qn & 0xfU) * (uint)uVar2 * 2));
              uVar14 = uVar14 + 1;
              pbVar12 = pbVar12 + lVar11;
            } while (filter_params_y->taps != uVar14);
          }
          bVar1 = (byte)conv_params->round_1;
          iVar10 = (((1 << (bVar1 & 0x1f)) >> 1) + (iVar10 << (7U - cVar6 & 0x1f)) >> (bVar1 & 0x1f)
                   ) + iVar13;
          if (conv_params->do_average == 0) {
            pCVar4[lVar8 + uVar16] = (CONV_BUF_TYPE)iVar10;
          }
          else {
            uVar7 = (uint)pCVar4[lVar8 + uVar16];
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              iVar10 = (int)(iVar10 + uVar7) >> 1;
            }
            else {
              iVar10 = (int)(iVar10 * conv_params->bck_offset + uVar7 * conv_params->fwd_offset) >>
                       4;
            }
            iVar10 = iVar10 + (((1 << (0xeU - cVar9 & 0x1f)) >> 1) - iVar13) >>
                     (0xeU - cVar9 & 0x1f);
            if (iVar10 < 1) {
              iVar10 = 0;
            }
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            dst[uVar16 + local_70 * (long)dst_stride] = (uint8_t)iVar10;
          }
          uVar16 = uVar16 + 1;
          pbVar15 = pbVar15 + 1;
        } while (uVar16 != (uint)w);
      }
      local_70 = local_70 + 1;
      local_78 = local_78 + lVar11;
    } while (local_70 != (uint)h);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_c(const uint8_t *src, int src_stride, uint8_t *dst,
                               int dst_stride, int w, int h,
                               const InterpFilterParams *filter_params_y,
                               const int subpel_y_qn,
                               ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      res *= (1 << bits);
      res = ROUND_POWER_OF_TWO(res, conv_params->round_1) + round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel(ROUND_POWER_OF_TWO(tmp, round_bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}